

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::Context::clearFilters(Context *this)

{
  pointer pSVar1;
  pointer pSVar2;
  ContextState *pCVar3;
  pointer pvVar4;
  ulong uVar5;
  pointer pSVar6;
  ulong uVar7;
  
  pCVar3 = this->p;
  pvVar4 = (pCVar3->filters).
           super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pCVar3->filters).
      super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar4) {
    uVar7 = 0;
    do {
      pSVar1 = pvVar4[uVar7].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pSVar2 = pvVar4[uVar7].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pSVar6 = pSVar1;
      if (pSVar2 != pSVar1) {
        do {
          free(pSVar6->m_str);
          pSVar6 = pSVar6 + 1;
        } while (pSVar6 != pSVar2);
        pvVar4[uVar7].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar1;
        pCVar3 = this->p;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      pvVar4 = (pCVar3->filters).
               super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(pCVar3->filters).
                     super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
              -0x5555555555555555;
    } while (uVar7 <= uVar5 && uVar5 - uVar7 != 0);
  }
  return;
}

Assistant:

void Context::clearFilters() {
    for(unsigned i = 0; i < p->filters.size(); ++i)
        p->filters[i].clear();
}